

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int Curl_resolv_timeout(connectdata *conn,char *hostname,int port,Curl_dns_entry **entry,
                       time_t timeoutms)

{
  Curl_easy *data;
  int iVar1;
  uint __seconds;
  int iVar2;
  ulong uVar3;
  timeval newer;
  _Bool keep_copysig;
  uint prev_alarm;
  long timeout;
  sigaction keep_sigact;
  sigaction sigact;
  uint local_174;
  long local_170;
  sigaction local_160;
  sigaction local_c8;
  
  local_174 = 0;
  data = conn->data;
  *entry = (Curl_dns_entry *)0x0;
  if (-1 < timeoutms) {
    local_170 = timeoutms;
    if ((data->set).no_signal == true) {
      local_170 = 0;
    }
    if (local_170 == 0) {
      iVar1 = Curl_resolv(conn,hostname,port,entry);
      return iVar1;
    }
    if (local_170 < 1000) {
      Curl_failf(data,"remaining timeout of %ld too small to resolve via SIGALRM method",local_170);
    }
    else {
      iVar1 = __sigsetjmp(curl_jmpenv,1);
      if (iVar1 == 0) {
        sigaction(0xe,(sigaction *)0x0,&local_c8);
        memcpy(&local_160,&local_c8,0x98);
        local_c8.__sigaction_handler.sa_handler = alarmfunc;
        local_c8.sa_flags._3_1_ = local_c8.sa_flags._3_1_ & 0xef;
        sigaction(0xe,&local_c8,(sigaction *)0x0);
        __seconds = curlx_sltoui(local_170 / 1000);
        local_174 = alarm(__seconds);
        iVar2 = Curl_resolv(conn,hostname,port,entry);
      }
      else {
        Curl_failf(data,"name lookup timed out");
        iVar2 = -1;
      }
      if (local_174 == 0) {
        alarm(0);
      }
      if (iVar1 == 0) {
        sigaction(0xe,&local_160,(sigaction *)0x0);
      }
      if (local_174 == 0) {
        return iVar2;
      }
      newer = curlx_tvnow();
      uVar3 = curlx_tvdiff(newer,conn->created);
      uVar3 = (ulong)local_174 - uVar3 / 1000;
      if ((uVar3 != 0) && ((uVar3 >> 0x1f == 0 || ((int)local_174 < 0)))) {
        alarm((uint)uVar3);
        return iVar2;
      }
      alarm(1);
      Curl_failf(data,"Previous alarm fired off!");
    }
  }
  return -2;
}

Assistant:

int Curl_resolv_timeout(struct connectdata *conn,
                        const char *hostname,
                        int port,
                        struct Curl_dns_entry **entry,
                        time_t timeoutms)
{
#ifdef USE_ALARM_TIMEOUT
#ifdef HAVE_SIGACTION
  struct sigaction keep_sigact;   /* store the old struct here */
  volatile bool keep_copysig = FALSE; /* wether old sigact has been saved */
  struct sigaction sigact;
#else
#ifdef HAVE_SIGNAL
  void (*keep_sigact)(int);       /* store the old handler here */
#endif /* HAVE_SIGNAL */
#endif /* HAVE_SIGACTION */
  volatile long timeout;
  volatile unsigned int prev_alarm = 0;
  struct Curl_easy *data = conn->data;
#endif /* USE_ALARM_TIMEOUT */
  int rc;

  *entry = NULL;

  if(timeoutms < 0)
    /* got an already expired timeout */
    return CURLRESOLV_TIMEDOUT;

#ifdef USE_ALARM_TIMEOUT
  if(data->set.no_signal)
    /* Ignore the timeout when signals are disabled */
    timeout = 0;
  else
    timeout = timeoutms;

  if(!timeout)
    /* USE_ALARM_TIMEOUT defined, but no timeout actually requested */
    return Curl_resolv(conn, hostname, port, entry);

  if(timeout < 1000) {
    /* The alarm() function only provides integer second resolution, so if
       we want to wait less than one second we must bail out already now. */
    failf(data,
        "remaining timeout of %ld too small to resolve via SIGALRM method",
        timeout);
    return CURLRESOLV_TIMEDOUT;
  }
  /* This allows us to time-out from the name resolver, as the timeout
     will generate a signal and we will siglongjmp() from that here.
     This technique has problems (see alarmfunc).
     This should be the last thing we do before calling Curl_resolv(),
     as otherwise we'd have to worry about variables that get modified
     before we invoke Curl_resolv() (and thus use "volatile"). */
  if(sigsetjmp(curl_jmpenv, 1)) {
    /* this is coming from a siglongjmp() after an alarm signal */
    failf(data, "name lookup timed out");
    rc = CURLRESOLV_ERROR;
    goto clean_up;
  }
  else {
    /*************************************************************
     * Set signal handler to catch SIGALRM
     * Store the old value to be able to set it back later!
     *************************************************************/
#ifdef HAVE_SIGACTION
    sigaction(SIGALRM, NULL, &sigact);
    keep_sigact = sigact;
    keep_copysig = TRUE; /* yes, we have a copy */
    sigact.sa_handler = alarmfunc;
#ifdef SA_RESTART
    /* HPUX doesn't have SA_RESTART but defaults to that behaviour! */
    sigact.sa_flags &= ~SA_RESTART;
#endif
    /* now set the new struct */
    sigaction(SIGALRM, &sigact, NULL);
#else /* HAVE_SIGACTION */
    /* no sigaction(), revert to the much lamer signal() */
#ifdef HAVE_SIGNAL
    keep_sigact = signal(SIGALRM, alarmfunc);
#endif
#endif /* HAVE_SIGACTION */

    /* alarm() makes a signal get sent when the timeout fires off, and that
       will abort system calls */
    prev_alarm = alarm(curlx_sltoui(timeout/1000L));
  }

#else
#ifndef CURLRES_ASYNCH
  if(timeoutms)
    infof(conn->data, "timeout on name lookup is not supported\n");
#else
  (void)timeoutms; /* timeoutms not used with an async resolver */
#endif
#endif /* USE_ALARM_TIMEOUT */

  /* Perform the actual name resolution. This might be interrupted by an
   * alarm if it takes too long.
   */
  rc = Curl_resolv(conn, hostname, port, entry);

#ifdef USE_ALARM_TIMEOUT
clean_up:

  if(!prev_alarm)
    /* deactivate a possibly active alarm before uninstalling the handler */
    alarm(0);

#ifdef HAVE_SIGACTION
  if(keep_copysig) {
    /* we got a struct as it looked before, now put that one back nice
       and clean */
    sigaction(SIGALRM, &keep_sigact, NULL); /* put it back */
  }
#else
#ifdef HAVE_SIGNAL
  /* restore the previous SIGALRM handler */
  signal(SIGALRM, keep_sigact);
#endif
#endif /* HAVE_SIGACTION */

  /* switch back the alarm() to either zero or to what it was before minus
     the time we spent until now! */
  if(prev_alarm) {
    /* there was an alarm() set before us, now put it back */
    unsigned long elapsed_ms = Curl_tvdiff(Curl_tvnow(), conn->created);

    /* the alarm period is counted in even number of seconds */
    unsigned long alarm_set = prev_alarm - elapsed_ms/1000;

    if(!alarm_set ||
       ((alarm_set >= 0x80000000) && (prev_alarm < 0x80000000)) ) {
      /* if the alarm time-left reached zero or turned "negative" (counted
         with unsigned values), we should fire off a SIGALRM here, but we
         won't, and zero would be to switch it off so we never set it to
         less than 1! */
      alarm(1);
      rc = CURLRESOLV_TIMEDOUT;
      failf(data, "Previous alarm fired off!");
    }
    else
      alarm((unsigned int)alarm_set);
  }
#endif /* USE_ALARM_TIMEOUT */

  return rc;
}